

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::
Own<kj::_::AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>,_kj::_::PromiseDisposer>
::dispose(Own<kj::_::AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>,_kj::_::PromiseDisposer>
          *this)

{
  AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
  *node;
  AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
  *ptrCopy;
  Own<kj::_::AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>,_kj::_::PromiseDisposer>
  *this_local;
  
  node = this->ptr;
  if (node != (AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
               *)0x0) {
    this->ptr = (AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
                 *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      StaticDisposer::dispose(ptrCopy);
    }
  }